

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lodepng.cpp
# Opt level: O0

uint lodepng_can_have_alpha(LodePNGColorMode *info)

{
  uint uVar1;
  LodePNGColorMode *in_RDI;
  bool local_9;
  
  local_9 = true;
  if (in_RDI->key_defined == 0) {
    uVar1 = lodepng_is_alpha_type(in_RDI);
    local_9 = true;
    if (uVar1 == 0) {
      uVar1 = lodepng_has_palette_alpha(in_RDI);
      local_9 = uVar1 != 0;
    }
  }
  return (uint)local_9;
}

Assistant:

unsigned lodepng_can_have_alpha(const LodePNGColorMode* info) {
  return info->key_defined
    || lodepng_is_alpha_type(info)
    || lodepng_has_palette_alpha(info);
}